

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O2

void predict(ect *e,single_learner *base,example *ec)

{
  float fVar1;
  uint uVar2;
  uint32_t uVar3;
  ostream *poVar4;
  
  uVar2 = (ec->l).multi.label;
  fVar1 = (ec->l).simple.weight;
  if (((ulong)uVar2 == 0) || ((uVar2 != 0xffffffff && (e->k < (ulong)uVar2)))) {
    poVar4 = std::operator<<((ostream *)&std::cout,"label ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," is not in {1,");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"} This won\'t work right.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  uVar3 = ect_predict(e,base,ec);
  (ec->pred).multiclass = uVar3;
  (ec->l).multi.label = uVar2;
  (ec->l).simple.weight = fVar1;
  return;
}

Assistant:

void predict(ect& e, single_learner& base, example& ec)
{
  MULTICLASS::label_t mc = ec.l.multi;
  if (mc.label == 0 || (mc.label > e.k && mc.label != (uint32_t)-1))
    cout << "label " << mc.label << " is not in {1," << e.k << "} This won't work right." << endl;
  ec.pred.multiclass = ect_predict(e, base, ec);
  ec.l.multi = mc;
}